

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

bool __thiscall
ON_SerialNumberMap::Internal_HashTableRemoveSerialNumberBlock
          (ON_SerialNumberMap *this,ON_SN_BLOCK *blk)

{
  ON__UINT32 OVar1;
  SN_ELEMENT **ppSVar2;
  ON__UINT32 local_44;
  ON__UINT32 hash_i;
  ON__UINT32 i;
  SN_ELEMENT *prev;
  SN_ELEMENT *h;
  SN_ELEMENT **hash_table_block;
  SN_ELEMENT *e;
  bool rc;
  ON_SN_BLOCK *blk_local;
  ON_SerialNumberMap *this_local;
  
  e._7_1_ = false;
  if ((this->m_bHashTableIsValid != '\0') && ((ulong)(blk->m_count << 7) < this->m_active_id_count))
  {
    e._7_1_ = true;
    hash_table_block = (SN_ELEMENT **)blk->m_sn;
    local_44 = blk->m_count;
    while (local_44 != 0) {
      if (*(char *)((long)hash_table_block + 0x19) != '\0') {
        ppSVar2 = Internal_HashTableBlock(this,*(ON__UINT32 *)((long)hash_table_block + 0x1c));
        OVar1 = Internal_HashTableBlockRowIndex(*(ON__UINT32 *)((long)hash_table_block + 0x1c));
        _hash_i = (SN_ELEMENT *)0x0;
        for (prev = ppSVar2[OVar1]; prev != (SN_ELEMENT *)0x0; prev = prev->m_next) {
          if (prev == (SN_ELEMENT *)hash_table_block) {
            this->m_active_id_count = this->m_active_id_count - 1;
            if (_hash_i == (SN_ELEMENT *)0x0) {
              ppSVar2[OVar1] = prev->m_next;
            }
            else {
              _hash_i->m_next = prev->m_next;
            }
            break;
          }
          _hash_i = prev;
        }
      }
      hash_table_block = hash_table_block + 7;
      local_44 = local_44 - 1;
    }
  }
  return e._7_1_;
}

Assistant:

bool ON_SerialNumberMap::Internal_HashTableRemoveSerialNumberBlock(const ON_SN_BLOCK* blk)
{
  // quickly remove every id in the block from the hash table.
  // This is done when the block is small compared to the
  // size of the hash table and removing the elements from
  // the hash table, rearranging the block, and then adding
  // the elements back into the hash table is faster than
  // simply rebuilding the hash table.
  //
  // The 128 multiplier is determined as follows:
  // - C = average number of elements with the same hash index
  //     = m_active_id_count/m_hash_capacity.
  // - D = cost of destroying hash table = time to memset the table
  //       to zero.
  // - H = cost of calculating the hash table index of an id.
  // - A = The cost of adding an element to the hash table is
  //       H + two pointer assignments with is essentially H.
  // - F = The average cost of finding an element in the hash
  //       table is H plus going through half the linked list
  //       of elements at that hash index (C/2 pointer dereferences).
  // - B = number of elements in a block.
  // - I = (number times a valid hash table is destroyed)/
  //       (number of times the hash table is rebuilt).
  // - R = rebuild cost = A*m_active_id_count.
  // - Keeping the the has table up to date only makes sense if
  //   R > I*(A+F)*active_id_count
  //   it is needed often enough to justify ...
  bool rc = false;
  if ( m_bHashTableIsValid && m_active_id_count > 128*blk->m_count )
  {
    const SN_ELEMENT* e;
    struct SN_ELEMENT** hash_table_block;
    SN_ELEMENT* h;
    SN_ELEMENT* prev;
    ON__UINT32 i;
    rc = true;
    for (e = blk->m_sn, i = blk->m_count; i--; e++)
    {
      if ( 0 == e->m_id_active )
        continue;
      hash_table_block = Internal_HashTableBlock(e->m_id_crc32);
      ON__UINT32 hash_i = Internal_HashTableBlockRowIndex(e->m_id_crc32);
      prev = 0;
      for ( h = hash_table_block[hash_i]; nullptr !=  h; h = h->m_next )
      {
        if (h == e)
        {
          // Do not change value of SN_ELEMENT's m_id_active.
          // This value is needed by AddBlockToHashTableHelper()
          // when it add the element back in.
          m_active_id_count--;
          if (prev)
            prev->m_next = h->m_next;
          else
            hash_table_block[hash_i] = h->m_next;
          break;
        }
        prev = h;
      }
    }
  }
  return rc;
}